

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

void __thiscall llvm::DataExtractor::skip(DataExtractor *this,Cursor *C,uint64_t Length)

{
  ulong in_RAX;
  ulong uVar1;
  char *Msg;
  ErrorInfoBase *pEVar2;
  error_code EC;
  ulong local_18;
  
  uVar1 = (ulong)(C->Err).Payload & 0xfffffffffffffffe;
  (C->Err).Payload = (ErrorInfoBase *)(uVar1 != 0 | uVar1);
  if (uVar1 == 0) {
    uVar1 = C->Offset;
    if ((uVar1 + Length < uVar1) || ((this->Data).Length <= (uVar1 + Length) - 1)) {
      local_18 = in_RAX;
      Msg = (char *)std::_V2::generic_category();
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = &local_18;
      createStringError(EC,Msg);
      (C->Err).Payload = (ErrorInfoBase *)(local_18 | 1);
    }
    else {
      C->Offset = uVar1 + Length;
    }
  }
  uVar1 = (ulong)(C->Err).Payload & 0xfffffffffffffffe;
  pEVar2 = (ErrorInfoBase *)0x1;
  if (uVar1 != 0) {
    pEVar2 = (ErrorInfoBase *)(uVar1 != 0 | uVar1);
  }
  (C->Err).Payload = pEVar2;
  return;
}

Assistant:

void DataExtractor::skip(Cursor &C, uint64_t Length) const {
  ErrorAsOutParameter ErrAsOut(&C.Err);
  if (isError(&C.Err))
    return;

  if (isValidOffsetForDataOfSize(C.Offset, Length))
    C.Offset += Length;
  else
    unexpectedEndReached(&C.Err);
}